

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O2

void __thiscall packing::ProtoPalAttrs::banFrom(ProtoPalAttrs *this,size_t index)

{
  reference rVar1;
  
  if ((ulong)(this->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <= index) {
    std::vector<bool,_std::allocator<bool>_>::resize(&this->bannedPages,index + 1,false);
  }
  rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->bannedPages,index);
  *rVar1._M_p = *rVar1._M_p | rVar1._M_mask;
  return;
}

Assistant:

void banFrom(size_t index) {
		if (bannedPages.size() <= index) {
			bannedPages.resize(index + 1);
		}
		bannedPages[index] = true;
	}